

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull)

{
  Table *pTVar1;
  undefined2 uVar2;
  int iVar3;
  int iVar4;
  CollSeq *pCVar5;
  CollSeq *pCVar6;
  int iVar7;
  int *in_RCX;
  uint in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  int rMayHaveNull;
  u32 savedNQueryLoop;
  int iAddr_1;
  int affinity_ok;
  CollSeq *pReq;
  Index *pIdx;
  int iAddr;
  i16 iDb;
  i16 iCol;
  Expr *pExpr;
  Table *pTab;
  sqlite3 *db;
  Vdbe *v;
  int mustBeUnique;
  int iTab;
  int eType;
  Select *p;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined1 uVar8;
  Select *p_00;
  Select *pIdx_00;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 uVar9;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  Parse *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  Index *pIVar10;
  undefined4 in_stack_ffffffffffffffa0;
  ynVar yVar11;
  int local_2c;
  
  local_2c = 0;
  iVar7 = *(int *)(in_RDI + 10);
  *(int *)(in_RDI + 10) = iVar7 + 1;
  sqlite3GetVdbe((Parse *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  if ((*(uint *)(in_RSI + 4) & 0x800) == 0) {
    p_00 = (Select *)0x0;
  }
  else {
    p_00 = *(Select **)(in_RSI + 0x20);
  }
  if ((*(int *)((long)in_RDI + 0x4c) == 0) &&
     (pIdx_00 = p_00, iVar3 = isCandidateForInOpt(p_00), iVar3 != 0)) {
    pTVar1 = p_00->pSrc->a[0].pTab;
    yVar11 = p_00->pEList->a->pExpr->iColumn;
    iVar3 = sqlite3SchemaToIndex((sqlite3 *)*in_RDI,pTVar1->pSchema);
    uVar2 = (undefined2)iVar3;
    sqlite3CodeVerifySchema
              ((Parse *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (int)((ulong)pIdx_00 >> 0x20));
    sqlite3TableLock((Parse *)CONCAT26(yVar11,CONCAT24(uVar2,in_stack_ffffffffffffffa0)),
                     (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98,
                     (u8)((ulong)in_stack_ffffffffffffff90 >> 0x38),
                     (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (yVar11 < 0) {
      sqlite3CodeOnce((Parse *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      sqlite3OpenTable(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88
                       ,(Table *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (int)((ulong)pIdx_00 >> 0x20));
      local_2c = 1;
      sqlite3VdbeJumpHere((Vdbe *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6c);
    }
    else {
      pCVar5 = sqlite3BinaryCompareCollSeq
                         ((Parse *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (Expr *)pIdx_00,
                          (Expr *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      iVar3 = sqlite3IndexAffinityOk
                        ((Expr *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),'\0')
      ;
      pIVar10 = pTVar1->pIndex;
      while( true ) {
        uVar8 = false;
        if ((pIVar10 != (Index *)0x0) && (uVar8 = false, local_2c == 0)) {
          uVar8 = iVar3 != 0;
        }
        if ((bool)uVar8 == false) break;
        if (((*pIVar10->aiColumn == yVar11) &&
            (pCVar6 = sqlite3FindCollSeq((sqlite3 *)
                                         CONCAT44(in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80),
                                         (u8)((ulong)pIdx_00 >> 0x38),
                                         (char *)CONCAT17(uVar8,in_stack_ffffffffffffff70),
                                         in_stack_ffffffffffffff6c), pCVar6 == pCVar5)) &&
           (((in_EDX & 4) == 0 || ((pIVar10->nKeyCol == 1 && (pIVar10->onError != '\0')))))) {
          iVar4 = sqlite3CodeOnce((Parse *)CONCAT17(uVar8,in_stack_ffffffffffffff70));
          sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iVar3,iVar4),in_stack_ffffffffffffff84,
                            in_stack_ffffffffffffff80,(int)((ulong)pIdx_00 >> 0x20),(int)pIdx_00);
          sqlite3VdbeSetP4KeyInfo
                    ((Parse *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (Index *)pIdx_00);
          local_2c = *pIVar10->aSortOrder + 3;
          if ((in_RCX != (int *)0x0) && (pTVar1->aCol[yVar11].notNull == '\0')) {
            iVar4 = *(int *)((long)in_RDI + 0x54) + 1;
            *(int *)((long)in_RDI + 0x54) = iVar4;
            *in_RCX = iVar4;
            sqlite3SetHasNullFlag
                      ((Vdbe *)CONCAT17(uVar8,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c,
                       in_stack_ffffffffffffff68);
          }
          sqlite3VdbeJumpHere((Vdbe *)CONCAT17(uVar8,in_stack_ffffffffffffff70),
                              in_stack_ffffffffffffff6c);
        }
        pIVar10 = pIVar10->pNext;
      }
      in_stack_ffffffffffffff77 = 0;
    }
  }
  if ((((local_2c == 0) && ((in_EDX & 1) != 0)) && ((*(uint *)(in_RSI + 4) & 0x800) == 0)) &&
     ((iVar3 = sqlite3InRhsIsConstant
                         ((Expr *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)),
      iVar3 == 0 || (**(int **)(in_RSI + 0x20) < 3)))) {
    local_2c = 5;
  }
  if (local_2c == 0) {
    uVar9 = *(undefined4 *)(in_RDI + 0x3b);
    local_2c = 2;
    if ((in_EDX & 4) == 0) {
      if (in_RCX != (int *)0x0) {
        iVar7 = *(int *)((long)in_RDI + 0x54) + 1;
        *(int *)((long)in_RDI + 0x54) = iVar7;
        *in_RCX = iVar7;
      }
    }
    else {
      *(undefined4 *)(in_RDI + 0x3b) = 0;
      if ((*(short *)(*(long *)(in_RSI + 0x10) + 0x30) < 0) &&
         ((*(uint *)(in_RSI + 4) & 0x800) == 0)) {
        local_2c = 1;
      }
    }
    sqlite3CodeSubselect((Parse *)pTab,pExpr,_iDb,iAddr);
    *(undefined4 *)(in_RDI + 0x3b) = uVar9;
  }
  else {
    *(int *)(in_RSI + 0x2c) = iVar7;
  }
  return local_2c;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(Parse *pParse, Expr *pX, u32 inFlags, int *prRhsHasNull){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab = pParse->nTab++;            /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new 
  ** ephemeral table.
  */
  p = (ExprHasProperty(pX, EP_xIsSelect) ? pX->x.pSelect : 0);
  if( ALWAYS(pParse->nErr==0) && isCandidateForInOpt(p) ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    Expr *pExpr;                           /* Expression <column> */
    i16 iCol;                              /* Index of column <column> */
    i16 iDb;                               /* Database idx for pTab */

    assert( p );                        /* Because of isCandidateForInOpt(p) */
    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;
    pExpr = p->pEList->a[0].pExpr;
    iCol = (i16)pExpr->iColumn;
   
    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    /* This function is only called from two places. In both cases the vdbe
    ** has already been allocated. So assume sqlite3GetVdbe() is always
    ** successful here.
    */
    assert(v);
    if( iCol<0 ){
      int iAddr = sqlite3CodeOnce(pParse);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;

      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */

      /* The collation sequence used by the comparison. If an index is to
      ** be used in place of a temp-table, it must be ordered according
      ** to this collation sequence.  */
      CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pX->pLeft, pExpr);

      /* Check that the affinity that will be used to perform the 
      ** comparison is the same as the affinity of the column. If
      ** it is not, it is not possible to use any index.
      */
      int affinity_ok = sqlite3IndexAffinityOk(pX, pTab->aCol[iCol].affinity);

      for(pIdx=pTab->pIndex; pIdx && eType==0 && affinity_ok; pIdx=pIdx->pNext){
        if( (pIdx->aiColumn[0]==iCol)
         && sqlite3FindCollSeq(db, ENC(db), pIdx->azColl[0], 0)==pReq
         && (!mustBeUnique || (pIdx->nKeyCol==1 && IsUniqueIndex(pIdx)))
        ){
          int iAddr = sqlite3CodeOnce(pParse); VdbeCoverage(v);
          sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
          sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
          VdbeComment((v, "%s", pIdx->zName));
          assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
          eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];

          if( prRhsHasNull && !pTab->aCol[iCol].notNull ){
            *prRhsHasNull = ++pParse->nMem;
            sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
          }
          sqlite3VdbeJumpHere(v, iAddr);
        }
      }
    }
  }

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not contant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && !ExprHasProperty(pX, EP_xIsSelect)
   && (!sqlite3InRhsIsConstant(pX) || pX->x.pList->nExpr<=2)
  ){
    eType = IN_INDEX_NOOP;
  }
     

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
      if( pX->pLeft->iColumn<0 && !ExprHasProperty(pX, EP_xIsSelect) ){
        eType = IN_INDEX_ROWID;
      }
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    sqlite3CodeSubselect(pParse, pX, rMayHaveNull, eType==IN_INDEX_ROWID);
    pParse->nQueryLoop = savedNQueryLoop;
  }else{
    pX->iTable = iTab;
  }
  return eType;
}